

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_print(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined1 auVar1 [16];
  size_t in_RAX;
  char *ptr;
  ulong uVar2;
  ulong uVar3;
  JSValue val1;
  ulong uStack_40;
  size_t len;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar3 = uVar2;
  }
  len = in_RAX;
  do {
    if (uVar3 * 0x10 == uVar2) {
      putchar(10);
      uStack_40 = 3;
LAB_0010d33e:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uStack_40;
      return (JSValue)(auVar1 << 0x40);
    }
    if (uVar2 != 0) {
      putchar(0x20);
    }
    val1.tag = *(int64_t *)((long)&argv->tag + uVar2);
    val1.u.ptr = ((JSValueUnion *)((long)&argv->u + uVar2))->ptr;
    ptr = JS_ToCStringLen(ctx,&len,val1);
    if (ptr == (char *)0x0) {
      uStack_40 = 6;
      goto LAB_0010d33e;
    }
    fwrite(ptr,1,len,_stdout);
    JS_FreeCString(ctx,ptr);
    uVar2 = uVar2 + 0x10;
  } while( true );
}

Assistant:

static JSValue js_print(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    int i;
    const char *str;
    size_t len;

    for(i = 0; i < argc; i++) {
        if (i != 0)
            putchar(' ');
        str = JS_ToCStringLen(ctx, &len, argv[i]);
        if (!str)
            return JS_EXCEPTION;
        fwrite(str, 1, len, stdout);
        JS_FreeCString(ctx, str);
    }
    putchar('\n');
    return JS_UNDEFINED;
}